

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

size_t check_for_leftover_values_list(ListNode *head,char *error_message)

{
  undefined8 *puVar1;
  int iVar2;
  char *in_RSI;
  long *in_RDI;
  FuncOrderingValue *o;
  size_t leftover_count;
  ListNode *child_node;
  size_t local_20;
  long *local_18;
  
  local_20 = 0;
  iVar2 = list_empty((ListNode *)0x1845a1);
  if (iVar2 == 0) {
    for (local_18 = (long *)in_RDI[2]; local_18 != in_RDI; local_18 = (long *)local_18[2]) {
      puVar1 = (undefined8 *)*local_18;
      cm_print_error(in_RSI,"%s",puVar1[2]);
      cm_print_error("%s:%u: note: remaining item was declared here\n",*puVar1,
                     (ulong)*(uint *)(puVar1 + 1));
      local_20 = local_20 + 1;
    }
  }
  return local_20;
}

Assistant:

static size_t check_for_leftover_values_list(const ListNode * head,
                                             const char * const error_message)
{
    ListNode *child_node;
    size_t leftover_count = 0;
    if (!list_empty(head))
    {
        for (child_node = head->next; child_node != head;
                 child_node = child_node->next, ++leftover_count) {
            const FuncOrderingValue *const o =
                    (const FuncOrderingValue*) child_node->value;
            cm_print_error(error_message, "%s", o->function);
            cm_print_error(SOURCE_LOCATION_FORMAT
                    ": note: remaining item was declared here\n",
                    o->location.file, o->location.line);
        }
    }
    return leftover_count;
}